

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O1

cbtVector3 __thiscall cbtBoxShape::localGetSupportingVertex(cbtBoxShape *this,cbtVector3 *vec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  cbtVector3 cVar14;
  
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  fVar2 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[1];
  fVar3 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  fVar8 = fVar3;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  fVar9 = fVar8;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  fVar10 = fVar9;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  fVar8 = fVar8 + fVar1;
  fVar9 = fVar9 + fVar2;
  fVar10 = fVar10 + fVar3;
  auVar12._0_4_ = -fVar8;
  auVar12._4_4_ = 0x80000000;
  auVar12._8_4_ = 0x80000000;
  auVar12._12_4_ = 0x80000000;
  auVar13 = ZEXT816(0) << 0x40;
  uVar4 = vcmpss_avx512f(auVar13,ZEXT416((uint)vec->m_floats[0]),2);
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar6._4_12_ = auVar12._4_12_;
  auVar6._0_4_ = (uint)bVar5 * (int)fVar8 + (uint)!bVar5 * (int)auVar12._0_4_;
  auVar11._0_4_ = -fVar9;
  auVar11._4_4_ = 0x80000000;
  auVar11._8_4_ = 0x80000000;
  auVar11._12_4_ = 0x80000000;
  uVar4 = vcmpss_avx512f(auVar13,ZEXT416((uint)vec->m_floats[1]),2);
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar7._4_12_ = auVar11._4_12_;
  auVar7._0_4_ = (uint)bVar5 * (int)fVar9 + (uint)!bVar5 * (int)auVar11._0_4_;
  uVar4 = vcmpss_avx512f(auVar13,ZEXT416((uint)vec->m_floats[2]),2);
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar6 = vinsertps_avx(auVar6,auVar7,0x10);
  cVar14.m_floats._0_8_ = auVar6._0_8_;
  cVar14.m_floats[2] = (cbtScalar)((uint)bVar5 * (int)fVar10 + (uint)!bVar5 * (int)-fVar10);
  cVar14.m_floats[3] = 0.0;
  return (cbtVector3)cVar14.m_floats;
}

Assistant:

virtual cbtVector3 localGetSupportingVertex(const cbtVector3& vec) const
	{
		cbtVector3 halfExtents = getHalfExtentsWithoutMargin();
		cbtVector3 margin(getMargin(), getMargin(), getMargin());
		halfExtents += margin;

		return cbtVector3(cbtFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
						 cbtFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
						 cbtFsels(vec.z(), halfExtents.z(), -halfExtents.z()));
	}